

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
          (JavascriptPromiseReaction *this,SnapPromiseReactionInfo *snapPromiseReaction,
          List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *depOnList,SlabAllocator *alloc)

{
  RecyclableObject **ppRVar1;
  JavascriptPromiseCapability **ppJVar2;
  JavascriptPromiseReaction **ppJVar3;
  JavascriptPromiseCapability *this_00;
  JavascriptPromiseReaction *local_30;
  SlabAllocator *local_28;
  SlabAllocator *alloc_local;
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *depOnList_local;
  SnapPromiseReactionInfo *snapPromiseReaction_local;
  JavascriptPromiseReaction *this_local;
  
  local_28 = alloc;
  alloc_local = (SlabAllocator *)depOnList;
  depOnList_local =
       (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       snapPromiseReaction;
  snapPromiseReaction_local = (SnapPromiseReactionInfo *)this;
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->handler);
  if (*ppRVar1 != (RecyclableObject *)0x0) {
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromiseCapability__
                        ((WriteBarrierPtr *)&this->capabilities);
    if (*ppJVar2 != (JavascriptPromiseCapability *)0x0) {
      local_30 = this;
      ppJVar3 = Memory::PointerValue<Js::JavascriptPromiseReaction>(&local_30);
      (depOnList_local->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
      _vptr_ReadOnlyList = (_func_int **)*ppJVar3;
      ppRVar1 = Memory::PointerValue<Js::RecyclableObject>(&this->handler);
      (depOnList_local->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
      buffer = (Type)*ppRVar1;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                ((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)alloc_local,
                 (unsigned_long *)
                 &(depOnList_local->
                  super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer)
      ;
      this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::operator->
                          (&this->capabilities);
      JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
                (this_00,(SnapPromiseCapabilityInfo *)
                         &(depOnList_local->
                          super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>)
                          .count,
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)alloc_local,local_28);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReaction::ExtractSnapPromiseReactionInto(TTD::NSSnapValues::SnapPromiseReactionInfo* snapPromiseReaction, JsUtil::List<TTD_PTR_ID, HeapAllocator>& depOnList, TTD::SlabAllocator& alloc)
    {
        TTDAssert(this->handler != nullptr && this->capabilities != nullptr, "Seems odd, I was not expecting this!!!");

        snapPromiseReaction->PromiseReactionId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this);

        snapPromiseReaction->HandlerObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);
        depOnList.Add(snapPromiseReaction->HandlerObjId);

        this->capabilities->ExtractSnapPromiseCapabilityInto(&snapPromiseReaction->Capabilities, depOnList, alloc);
    }